

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O1

void t9(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  uint32_t p [10];
  undefined8 local_48 [4];
  uint local_24;
  
  puts("Script store/run/status/stop/delete tests.");
  gpio_write(0x19,0);
  callback(0x19,0,t9cbf);
  uVar1 = store_script("   ld p9 p0   tag 0   w p1 1   mils 5   w p1 0   mils 5   dcr p9   jp 0");
  do {
    time_sleep(0x3fb999999999999a);
    iVar2 = script_status(uVar1,local_48);
    iVar3 = t9_count;
  } while (iVar2 == 0);
  local_48[0] = 0x1900000063;
  run_script(uVar1,2,local_48);
  time_sleep(0x4000000000000000);
  CHECK(9,1,t9_count - iVar3,100,0,"store/run script");
  iVar3 = t9_count;
  local_48[0] = 0x19000000c8;
  run_script(uVar1,2,local_48);
  do {
    time_sleep(0x3fb999999999999a);
    iVar2 = script_status(uVar1,local_48);
  } while (iVar2 == 2);
  iVar3 = t9_count - iVar3;
  time_sleep(0x3fb999999999999a);
  CHECK(9,2,iVar3,0xc9,0,"run script/script status");
  iVar3 = t9_count;
  local_48[0] = 0x19000007d0;
  run_script(uVar1,2,local_48);
  time_sleep(0x3fb999999999999a);
  iVar2 = script_status(uVar1,local_48);
  while (iVar2 == 2) {
    if (local_24 < 0x640) {
      stop_script(uVar1);
    }
    time_sleep(0x3fb999999999999a);
    iVar2 = script_status(uVar1,local_48);
  }
  iVar3 = t9_count - iVar3;
  time_sleep(0x3fb999999999999a);
  CHECK(9,3,iVar3,0x19a,10,"run/stop script/script status");
  iVar3 = delete_script(uVar1);
  CHECK(9,4,iVar3,0,0,"delete script");
  return;
}

Assistant:

void t9()
{
   int s, oc, c, e;
   uint32_t p[10];

   printf("Script store/run/status/stop/delete tests.\n");

   gpio_write(GPIO, 0); /* need known state */

   /*
   100 loops per second
   p0 number of loops
   p1 GPIO
   */
   char *script="\
   ld p9 p0\
   tag 0\
   w p1 1\
   mils 5\
   w p1 0\
   mils 5\
   dcr p9\
   jp 0";

   callback(GPIO, RISING_EDGE, t9cbf);

   s = store_script(script);

   /* Wait for script to finish initing. */
   while (1)
   {
      time_sleep(0.1);
      e = script_status(s, p);
      if (e != PI_SCRIPT_INITING) break;
   }

   oc = t9_count;
   p[0] = 99;
   p[1] = GPIO;
   run_script(s, 2, p);
   time_sleep(2);
   c = t9_count - oc;
   CHECK(9, 1, c, 100, 0, "store/run script");

   oc = t9_count;
   p[0] = 200;
   p[1] = GPIO;
   run_script(s, 2, p);
   while (1)
   {
      time_sleep(0.1);
      e = script_status(s, p);
      if (e != PI_SCRIPT_RUNNING) break;
   }
   c = t9_count - oc;
   time_sleep(0.1);
   CHECK(9, 2, c, 201, 0, "run script/script status");

   oc = t9_count;
   p[0] = 2000;
   p[1] = GPIO;
   run_script(s, 2, p);
   while (1)
   {
      time_sleep(0.1);
      e = script_status(s, p);
      if (e != PI_SCRIPT_RUNNING) break;
      if (p[9] < 1600) stop_script(s);
   }
   c = t9_count - oc;
   time_sleep(0.1);
   CHECK(9, 3, c, 410, 10, "run/stop script/script status");

   e = delete_script(s);
   CHECK(9, 4, e, 0, 0, "delete script");
}